

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

int __thiscall create::Create::init(Create *this,EVP_PKEY_CTX *ctx)

{
  array_type *this_00;
  pointer pfVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  SerialQuery *pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ProtocolVersion PVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar6;
  pointer pfVar7;
  Data *this_01;
  bool local_4e;
  allocator<float> local_4d;
  value_type_conflict local_4c;
  SerialQuery *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  unbounded_array<float,_std::allocator<float>_> local_38;
  
  local_4e = SUB81(ctx,0);
  this->powerLEDIntensity = '\0';
  this->mainMotorPower = '\0';
  this->sideMotorPower = '\0';
  this->vacuumMotorPower = '\0';
  this->debrisLED = '\0';
  this->spotLED = '\0';
  this->dockLED = '\0';
  this->checkLED = '\0';
  this->powerLED = '\0';
  this->prevTicksLeft = 0;
  this->prevTicksRight = 0;
  this->totalLeftDist = 0.0;
  this->totalRightDist = 0.0;
  this->firstOnData = true;
  this->mode = MODE_OFF;
  (this->pose).x = 0.0;
  (this->pose).y = 0.0;
  (this->pose).yaw = 0.0;
  pfVar7 = (pointer)operator_new(0x24);
  pfVar7[0] = 0.0;
  pfVar7[1] = 0.0;
  pfVar7[2] = 0.0;
  pfVar7[3] = 0.0;
  pfVar7[4] = 0.0;
  pfVar7[5] = 0.0;
  pfVar7[6] = 0.0;
  pfVar7[7] = 0.0;
  pfVar7[8] = 0.0;
  pfVar1 = (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar7;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar7 + 9;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar7 + 9;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  (this->vel).x = 0.0;
  (this->vel).y = 0.0;
  (this->vel).yaw = 0.0;
  pfVar7 = (pointer)operator_new(0x24);
  pfVar7[0] = 0.0;
  pfVar7[1] = 0.0;
  pfVar7[2] = 0.0;
  pfVar7[3] = 0.0;
  pfVar7[4] = 0.0;
  pfVar7[5] = 0.0;
  pfVar7[6] = 0.0;
  pfVar7[7] = 0.0;
  pfVar7[8] = 0.0;
  pfVar1 = (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar7;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar7 + 9;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar7 + 9;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  local_4c = 0.0;
  local_48 = (SerialQuery *)0x3;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>::unbounded_array
            (&local_38,9,&local_4c,&local_4d);
  (this->poseCovar).size1_ = (size_type)local_48;
  (this->poseCovar).size2_ = (size_type)_Stack_40._M_pi;
  this_00 = &(this->poseCovar).data_;
  if (this_00 != &local_38) {
    boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>::resize_internal
              (this_00,local_38.size_,0.0,false);
    if (local_38.size_ != 0) {
      memmove((this->poseCovar).data_.data_,local_38.data_,local_38.size_ << 2);
    }
  }
  if (local_38.size_ != 0) {
    operator_delete(local_38.data_);
  }
  this->requestedLeftVel = 0.0;
  this->requestedRightVel = 0.0;
  this->dtHistoryLength = 'd';
  this->modeReportWorkaround = false;
  this_01 = (Data *)operator_new(0x50);
  PVar5 = RobotModel::getVersion(&this->model);
  Data::Data(this_01,PVar5);
  local_48 = (SerialQuery *)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<create::Data*>(&_Stack_40,this_01)
  ;
  _Var4._M_pi = _Stack_40._M_pi;
  pSVar3 = local_48;
  local_48 = (SerialQuery *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar3;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  PVar5 = RobotModel::getVersion(&this->model);
  if (PVar5 == V_1) {
    local_48 = (SerialQuery *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::SerialQuery,std::allocator<create::SerialQuery>,std::shared_ptr<create::Data>&,bool&>
              (&_Stack_40,&local_48,(allocator<create::SerialQuery> *)&local_4c,&this->data,
               &local_4e);
    std::__shared_ptr<create::SerialQuery,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<create::SerialQuery,create::SerialQuery>
              ((__shared_ptr<create::SerialQuery,(__gnu_cxx::_Lock_policy)2> *)&local_48,local_48);
    iVar6 = extraout_EAX;
  }
  else {
    local_48 = (SerialQuery *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::SerialStream,std::allocator<create::SerialStream>,std::shared_ptr<create::Data>&,unsigned_char_const&,bool&>
              (&_Stack_40,(SerialStream **)&local_48,(allocator<create::SerialStream> *)&local_4c,
               &this->data,"\x13",&local_4e);
    std::__shared_ptr<create::SerialStream,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<create::SerialStream,create::SerialStream>
              ((__shared_ptr<create::SerialStream,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (SerialStream *)local_48);
    iVar6 = extraout_EAX_00;
  }
  _Var4._M_pi = _Stack_40._M_pi;
  pSVar3 = local_48;
  local_48 = (SerialQuery *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pSVar3->super_Serial;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    iVar6 = extraout_EAX_01;
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    iVar6 = extraout_EAX_02;
  }
  return iVar6;
}

Assistant:

void Create::init(bool install_signal_handler) {
    mainMotorPower = 0;
    sideMotorPower = 0;
    vacuumMotorPower = 0;
    debrisLED = 0;
    spotLED = 0;
    dockLED = 0;
    checkLED = 0;
    powerLED = 0;
    powerLEDIntensity = 0;
    prevTicksLeft = 0;
    prevTicksRight = 0;
    totalLeftDist = 0.0;
    totalRightDist = 0.0;
    firstOnData = true;
    mode = MODE_OFF;
    pose.x = 0;
    pose.y = 0;
    pose.yaw = 0;
    pose.covariance = std::vector<float>(9, 0.0);
    vel.x = 0;
    vel.y = 0;
    vel.yaw = 0;
    vel.covariance = std::vector<float>(9, 0.0);
    poseCovar = Matrix(3, 3, 0.0);
    requestedLeftVel = 0;
    requestedRightVel = 0;
    dtHistoryLength = 100;
    modeReportWorkaround = false;
    data = std::shared_ptr<Data>(new Data(model.getVersion()));
    if (model.getVersion() == V_1) {
      serial = std::make_shared<SerialQuery>(data, install_signal_handler);
    } else {
      serial = std::make_shared<SerialStream>(
        data, create::util::STREAM_HEADER, install_signal_handler);
    }
  }